

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveModel.cpp
# Opt level: O3

void __thiscall WaveModel::setDataFromString(WaveModel *this,QString *str)

{
  Waveform *this_00;
  PermanentEditor ctx;
  QString local_68;
  string local_50;
  PermanentEditor local_30;
  
  Module::permanentEdit(&local_30,(this->super_GraphModel).mModule);
  this_00 = this->mWaveform;
  QString::toUtf8_helper(&local_68);
  if (local_68.d.ptr == (char16_t *)0x0) {
    local_68.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,local_68.d.ptr,local_68.d.size + (long)local_68.d.ptr);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,8);
    }
  }
  trackerboy::Waveform::fromString(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Module::PermanentEditor::~PermanentEditor(&local_30);
  GraphModel::dataChanged(&this->super_GraphModel);
  return;
}

Assistant:

void WaveModel::setDataFromString(QString const& str) {
 
    {
        auto ctx = mModule.permanentEdit();
        mWaveform->fromString(str.toStdString());
    }
    emit dataChanged();
}